

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_functions.hpp
# Opt level: O0

double WeightedPolynomial<ChebyshevT1WeightFunction>::evaluate
                 (vector<double,_std::allocator<double>_> *c,double x)

{
  double dVar1;
  double dVar2;
  vector<double,_std::allocator<double>_> local_30;
  double local_18;
  double x_local;
  vector<double,_std::allocator<double>_> *c_local;
  
  local_18 = x;
  x_local = (double)c;
  std::vector<double,_std::allocator<double>_>::vector(&local_30,c);
  dVar1 = Polynomial::evaluate(&local_30,local_18);
  dVar2 = ChebyshevT1WeightFunction::evaluate(local_18);
  std::vector<double,_std::allocator<double>_>::~vector(&local_30);
  return dVar1 * dVar2;
}

Assistant:

static double evaluate( std::vector<double> c, double x ) {
    return Polynomial::evaluate(c,x) * WeightFunctor::evaluate(x);
  }